

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

TPZManVector<std::pair<int,_long>,_60> * __thiscall
TPZManVector<std::pair<int,_long>,_60>::operator=
          (TPZManVector<std::pair<int,_long>,_60> *this,TPZManVector<std::pair<int,_long>,_60> *copy
          )

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  pair<int,_long> *ppVar4;
  TPZManVector<std::pair<int,_long>,_60> *in_RSI;
  TPZManVector<std::pair<int,_long>,_60> *in_RDI;
  int64_t i;
  int64_t nel;
  pair<int,_long> *local_68;
  long local_30;
  
  if (in_RDI != in_RSI) {
    uVar2 = TPZVec<std::pair<int,_long>_>::NElements(&in_RSI->super_TPZVec<std::pair<int,_long>_>);
    if ((((in_RDI->super_TPZVec<std::pair<int,_long>_>).fNAlloc < (long)uVar2) &&
        ((in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore != (pair<int,_long> *)0x0)) &&
       ((in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore != in_RDI->fExtAlloc)) {
      ppVar4 = (in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore;
      if (ppVar4 != (pair<int,_long> *)0x0) {
        operator_delete__(ppVar4);
      }
      (in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore = (pair<int,_long> *)0x0;
      (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNAlloc = 0;
    }
    if ((long)uVar2 < 0x3d) {
      if (((in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore != in_RDI->fExtAlloc) &&
         (ppVar4 = (in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore,
         ppVar4 != (pair<int,_long> *)0x0)) {
        operator_delete__(ppVar4);
      }
      (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNAlloc = 0;
      (in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore = in_RDI->fExtAlloc;
      (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNElements = uVar2;
    }
    else if ((in_RDI->super_TPZVec<std::pair<int,_long>_>).fNAlloc < (long)uVar2) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2;
      uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
      if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      ppVar4 = (pair<int,_long> *)operator_new__(uVar3);
      if (uVar2 != 0) {
        local_68 = ppVar4;
        do {
          std::pair<int,_long>::pair<int,_long,_true>(local_68);
          local_68 = local_68 + 1;
        } while (local_68 != ppVar4 + uVar2);
      }
      (in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore = ppVar4;
      (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNAlloc = uVar2;
      (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNElements = uVar2;
    }
    else {
      (in_RDI->super_TPZVec<std::pair<int,_long>_>).fNElements = uVar2;
    }
    for (local_30 = 0; local_30 < (long)uVar2; local_30 = local_30 + 1) {
      std::pair<int,_long>::operator=
                ((in_RDI->super_TPZVec<std::pair<int,_long>_>).fStore + local_30,
                 (in_RSI->super_TPZVec<std::pair<int,_long>_>).fStore + local_30);
    }
  }
  return in_RDI;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}